

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

void __thiscall QPDFParser::addInt(QPDFParser *this,int count)

{
  element_type *this_00;
  undefined1 local_28 [8];
  shared_ptr<QPDFObject> obj;
  int count_local;
  QPDFParser *this_local;
  
  obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = count;
  QPDFObject::create<QPDF_Integer,long_long&>((QPDFObject *)local_28,this->int_buffer + count % 2);
  this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_28);
  QPDFObject::setDescription
            (this_00,this->context,&this->description,
             this->last_offset_buffer
             [obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
              % 2]);
  add(this,(shared_ptr<QPDFObject> *)local_28);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_28);
  return;
}

Assistant:

void
QPDFParser::addInt(int count)
{
    auto obj = QPDFObject::create<QPDF_Integer>(int_buffer[count % 2]);
    obj->setDescription(context, description, last_offset_buffer[count % 2]);
    add(std::move(obj));
}